

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutpolicy.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *stream,QLayoutPolicy *policy)

{
  QDataStream *pQVar1;
  QDataStream *in_RSI;
  quint32 data;
  
  pQVar1 = QDataStream::operator<<
                     (in_RSI,*(uint *)in_RSI >> 0x10 & 0xf | (*(uint *)in_RSI >> 0x14 & 0xf) << 4 |
                             (*(uint *)in_RSI >> 0x1d & 1) << 8 |
                             (*(uint *)in_RSI >> 0x18 & 0x1f) << 9 |
                             (*(uint *)in_RSI >> 0x1e & 1) << 0xe |
                             (*(uint *)in_RSI >> 8 & 0xff) << 0x10 | *(int *)in_RSI << 0x18);
  return pQVar1;
}

Assistant:

QDataStream &operator<<(QDataStream &stream, const QLayoutPolicy &policy)
{
    // The order here is for historical reasons. (compatibility with Qt4)
    quint32 data = (policy.bits.horPolicy |         // [0, 3]
                    policy.bits.verPolicy << 4 |    // [4, 7]
                    policy.bits.hfw << 8 |          // [8]
                    policy.bits.ctype << 9 |        // [9, 13]
                    policy.bits.wfh << 14 |         // [14]
                  //policy.bits.padding << 15 |     // [15]
                    policy.bits.verStretch << 16 |  // [16, 23]
                    policy.bits.horStretch << 24);  // [24, 31]
    return stream << data;
}